

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O2

void __thiscall CommandDrawGem::Parse(CommandDrawGem *this,FScanner *sc,bool fullScreenOffsets)

{
  SBarInfo *pSVar1;
  bool bVar2;
  int iVar3;
  int *piVar4;
  
  while( true ) {
    bVar2 = FScanner::CheckToken(sc,0x101);
    if (!bVar2) break;
    bVar2 = FScanner::Compare(sc,"wiggle");
    if (bVar2) {
      this->wiggle = true;
    }
    else {
      bVar2 = FScanner::Compare(sc,"translatable");
      if (bVar2) {
        this->translatable = true;
      }
      else {
        bVar2 = FScanner::Compare(sc,"armor");
        if (bVar2) {
          this->armor = true;
        }
        else {
          bVar2 = FScanner::Compare(sc,"interpolate");
          if (bVar2) {
            FScanner::MustGetToken(sc,0x28);
            FScanner::MustGetToken(sc,0x104);
            this->interpolationSpeed = sc->Number;
            FScanner::MustGetToken(sc,0x29);
          }
          else {
            bVar2 = FScanner::Compare(sc,"reverse");
            if (bVar2) {
              this->reverse = true;
            }
            else {
              FScanner::ScriptError(sc,"Unknown drawgem flag \'%s\'.",sc->String);
            }
          }
        }
      }
    }
    bVar2 = FScanner::CheckToken(sc,0x7c);
    if (!bVar2) {
      FScanner::MustGetToken(sc,0x2c);
    }
  }
  FScanner::MustGetToken(sc,0x102);
  iVar3 = SBarInfo::newImage((this->super_SBarInfoCommand).script,sc->String);
  this->chain = iVar3;
  FScanner::MustGetToken(sc,0x2c);
  FScanner::MustGetToken(sc,0x102);
  iVar3 = SBarInfo::newImage((this->super_SBarInfoCommand).script,sc->String);
  this->gem = iVar3;
  FScanner::MustGetToken(sc,0x2c);
  bVar2 = FScanner::CheckToken(sc,0x2d);
  FScanner::MustGetToken(sc,0x104);
  iVar3 = -sc->Number;
  if (!bVar2) {
    iVar3 = sc->Number;
  }
  this->leftPadding = iVar3;
  FScanner::MustGetToken(sc,0x2c);
  bVar2 = FScanner::CheckToken(sc,0x2d);
  FScanner::MustGetToken(sc,0x104);
  iVar3 = -sc->Number;
  if (!bVar2) {
    iVar3 = sc->Number;
  }
  this->rightPadding = iVar3;
  FScanner::MustGetToken(sc,0x2c);
  FScanner::MustGetToken(sc,0x104);
  iVar3 = sc->Number;
  if (iVar3 < 0) {
    FScanner::ScriptError(sc,"Chain size must be a positive number.");
    iVar3 = sc->Number;
  }
  this->chainSize = iVar3 + 1;
  FScanner::MustGetToken(sc,0x2c);
  SBarInfoCommand::GetCoordinates
            (&this->super_SBarInfoCommand,sc,fullScreenOffsets,&this->x,&this->y);
  FScanner::MustGetToken(sc,0x3b);
  pSVar1 = (this->super_SBarInfoCommand).script;
  piVar4 = &this->interpolationSpeed;
  if ((&pSVar1->interpolateHealth)[this->armor] != false) {
    piVar4 = &pSVar1->interpolationSpeed + this->armor;
  }
  this->interpolationSpeed = *piVar4;
  return;
}

Assistant:

void	Parse(FScanner &sc, bool fullScreenOffsets)
		{
			while(sc.CheckToken(TK_Identifier))
			{
				if(sc.Compare("wiggle"))
					wiggle = true;
				else if(sc.Compare("translatable"))
					translatable = true;
				else if(sc.Compare("armor"))
					armor = true;
				else if(sc.Compare("interpolate"))
				{
					sc.MustGetToken('(');
					sc.MustGetToken(TK_IntConst);
					interpolationSpeed = sc.Number;
					sc.MustGetToken(')');
				}
				else if(sc.Compare("reverse"))
					reverse = true;
				else
					sc.ScriptError("Unknown drawgem flag '%s'.", sc.String);
				if(!sc.CheckToken('|'))
					sc.MustGetToken(',');
			}
			sc.MustGetToken(TK_StringConst); //chain
			chain = script->newImage(sc.String);
			sc.MustGetToken(',');
			sc.MustGetToken(TK_StringConst); //gem
			gem = script->newImage(sc.String);
			sc.MustGetToken(',');
			bool negative = sc.CheckToken('-');
			sc.MustGetToken(TK_IntConst);
			leftPadding = (negative ? -1 : 1) * sc.Number;
			sc.MustGetToken(',');
			negative = sc.CheckToken('-');
			sc.MustGetToken(TK_IntConst);
			rightPadding = (negative ? -1 : 1) * sc.Number;
			sc.MustGetToken(',');
			sc.MustGetToken(TK_IntConst);
			if(sc.Number < 0)
				sc.ScriptError("Chain size must be a positive number.");
			chainSize = sc.Number+1;
			sc.MustGetToken(',');
			GetCoordinates(sc, fullScreenOffsets, x, y);
			sc.MustGetToken(';');
		
			if(!armor)
				interpolationSpeed = script->interpolateHealth ? script->interpolationSpeed : interpolationSpeed;
			else
				interpolationSpeed = script->interpolateArmor ? script->armorInterpolationSpeed : interpolationSpeed;
		}